

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-readdir.c
# Opt level: O1

int run_test_fs_readdir_empty_dir(void)

{
  void *pvVar1;
  char *__s1;
  int iVar2;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar3;
  uv_fs_t *puVar4;
  uv_fs_t *puVar5;
  long lVar6;
  uv_fs_t rmdir_req;
  uv_fs_t mkdir_req;
  undefined1 auStack_c88 [440];
  uv_fs_t *puStack_ad0;
  undefined1 auStack_ac0 [440];
  uv_fs_t uStack_908;
  undefined1 auStack_750 [440];
  undefined1 auStack_598 [440];
  uv_fs_t *puStack_3e0;
  undefined1 local_380 [440];
  undefined1 local_1c8 [440];
  
  uVar3 = uv_default_loop();
  uv_fs_mkdir(uVar3,local_1c8,"./empty_dir/",0x1ff,0);
  uv_fs_req_cleanup(local_1c8);
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./empty_dir/",0);
  pvVar1 = opendir_req.ptr;
  if (iVar2 == 0) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a716;
    if (opendir_req.result != 0) goto LAB_0015a71b;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015a720;
    uv_fs_req_cleanup(&opendir_req);
    memset(&readdir_req,0xdb,0x1b8);
    *(uv_dirent_t **)pvVar1 = dirents;
    *(undefined8 *)((long)pvVar1 + 8) = 1;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_readdir(puVar4,&readdir_req,pvVar1,0);
    if (iVar2 != 0) goto LAB_0015a725;
    uv_fs_req_cleanup(&readdir_req);
    memset(&closedir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    uv_fs_closedir(puVar4,&closedir_req,pvVar1,0);
    if (closedir_req.result != 0) goto LAB_0015a72a;
    uv_fs_req_cleanup(&closedir_req);
    memset(&opendir_req,0xdb,0x1b8);
    memset(&readdir_req,0xdb,0x1b8);
    memset(&closedir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./empty_dir/",empty_opendir_cb);
    if (iVar2 != 0) goto LAB_0015a72f;
    if (empty_opendir_cb_count != 0) goto LAB_0015a734;
    if (empty_closedir_cb_count != 0) goto LAB_0015a739;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015a73e;
    if (empty_opendir_cb_count != 1) goto LAB_0015a743;
    if (empty_closedir_cb_count != 1) goto LAB_0015a748;
    uVar3 = uv_default_loop();
    uv_fs_rmdir(uVar3,local_380,"./empty_dir/",0);
    uv_fs_req_cleanup(local_380);
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_empty_dir_cold_1();
LAB_0015a716:
    run_test_fs_readdir_empty_dir_cold_2();
LAB_0015a71b:
    run_test_fs_readdir_empty_dir_cold_3();
LAB_0015a720:
    run_test_fs_readdir_empty_dir_cold_13();
LAB_0015a725:
    run_test_fs_readdir_empty_dir_cold_4();
LAB_0015a72a:
    run_test_fs_readdir_empty_dir_cold_5();
LAB_0015a72f:
    run_test_fs_readdir_empty_dir_cold_6();
LAB_0015a734:
    run_test_fs_readdir_empty_dir_cold_7();
LAB_0015a739:
    run_test_fs_readdir_empty_dir_cold_8();
LAB_0015a73e:
    run_test_fs_readdir_empty_dir_cold_9();
LAB_0015a743:
    run_test_fs_readdir_empty_dir_cold_10();
LAB_0015a748:
    run_test_fs_readdir_empty_dir_cold_11();
  }
  run_test_fs_readdir_empty_dir_cold_12();
  pvVar1 = opendir_req.ptr;
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a7cb;
    if (opendir_req.result != 0) goto LAB_0015a7d0;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015a7d5;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)pvVar1 + 8) = 1;
    uVar3 = uv_default_loop();
    iVar2 = uv_fs_readdir(uVar3,&readdir_req,pvVar1,empty_readdir_cb);
    if (iVar2 == 0) {
      iVar2 = uv_fs_req_cleanup(&opendir_req);
      empty_opendir_cb_count = empty_opendir_cb_count + 1;
      return iVar2;
    }
  }
  else {
    empty_opendir_cb_cold_1();
LAB_0015a7cb:
    empty_opendir_cb_cold_2();
LAB_0015a7d0:
    empty_opendir_cb_cold_3();
LAB_0015a7d5:
    empty_opendir_cb_cold_5();
  }
  empty_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./non-existing-dir/",0);
  if (iVar2 == -2) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a8e9;
    if (opendir_req.result != -2) goto LAB_0015a8ee;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015a8f3;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"./non-existing-dir/",non_existing_opendir_cb);
    if (iVar2 != 0) goto LAB_0015a8f8;
    if (non_existing_opendir_cb_count != 0) goto LAB_0015a8fd;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015a902;
    if (non_existing_opendir_cb_count != 1) goto LAB_0015a907;
    uVar3 = uv_default_loop();
    uv_walk(uVar3,close_walk_cb,0);
    uv_run(uVar3,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_non_existing_dir_cold_1();
LAB_0015a8e9:
    run_test_fs_readdir_non_existing_dir_cold_2();
LAB_0015a8ee:
    run_test_fs_readdir_non_existing_dir_cold_3();
LAB_0015a8f3:
    run_test_fs_readdir_non_existing_dir_cold_4();
LAB_0015a8f8:
    run_test_fs_readdir_non_existing_dir_cold_5();
LAB_0015a8fd:
    run_test_fs_readdir_non_existing_dir_cold_6();
LAB_0015a902:
    run_test_fs_readdir_non_existing_dir_cold_7();
LAB_0015a907:
    run_test_fs_readdir_non_existing_dir_cold_8();
  }
  run_test_fs_readdir_non_existing_dir_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015a954;
    if (opendir_req.result != -2) goto LAB_0015a959;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      non_existing_opendir_cb_count = non_existing_opendir_cb_count + 1;
      return extraout_EAX;
    }
  }
  else {
    non_existing_opendir_cb_cold_1();
LAB_0015a954:
    non_existing_opendir_cb_cold_2();
LAB_0015a959:
    non_existing_opendir_cb_cold_3();
  }
  non_existing_opendir_cb_cold_4();
  memset(&opendir_req,0xdb,0x1b8);
  puVar4 = (uv_fs_t *)uv_default_loop();
  iVar2 = uv_fs_opendir(puVar4,&opendir_req,"test/fixtures/empty_file",0);
  if (iVar2 == -0x14) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015aa6d;
    if (opendir_req.result != -0x14) goto LAB_0015aa72;
    if (opendir_req.ptr != (void *)0x0) goto LAB_0015aa77;
    uv_fs_req_cleanup(&opendir_req);
    memset(&opendir_req,0xdb,0x1b8);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_fs_opendir(puVar4,&opendir_req,"test/fixtures/empty_file",file_opendir_cb);
    if (iVar2 != 0) goto LAB_0015aa7c;
    if (file_opendir_cb_count != 0) goto LAB_0015aa81;
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_run(puVar4,0);
    if (iVar2 != 0) goto LAB_0015aa86;
    if (file_opendir_cb_count != 1) goto LAB_0015aa8b;
    puVar5 = (uv_fs_t *)uv_default_loop();
    uv_walk(puVar5,close_walk_cb,0);
    uv_run(puVar5,0);
    puVar4 = (uv_fs_t *)uv_default_loop();
    iVar2 = uv_loop_close();
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    run_test_fs_readdir_file_cold_1();
LAB_0015aa6d:
    run_test_fs_readdir_file_cold_2();
LAB_0015aa72:
    run_test_fs_readdir_file_cold_3();
LAB_0015aa77:
    run_test_fs_readdir_file_cold_4();
LAB_0015aa7c:
    run_test_fs_readdir_file_cold_5();
LAB_0015aa81:
    run_test_fs_readdir_file_cold_6();
LAB_0015aa86:
    run_test_fs_readdir_file_cold_7();
LAB_0015aa8b:
    puVar5 = &opendir_req;
    run_test_fs_readdir_file_cold_8();
  }
  run_test_fs_readdir_file_cold_9();
  if (puVar4 == &opendir_req) {
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015aad8;
    if (opendir_req.result != -0x14) goto LAB_0015aadd;
    if (opendir_req.ptr == (void *)0x0) {
      uv_fs_req_cleanup(&opendir_req);
      file_opendir_cb_count = file_opendir_cb_count + 1;
      return extraout_EAX_00;
    }
  }
  else {
    file_opendir_cb_cold_1();
LAB_0015aad8:
    file_opendir_cb_cold_2();
LAB_0015aadd:
    file_opendir_cb_cold_3();
  }
  file_opendir_cb_cold_4();
  puStack_ad0 = (uv_fs_t *)0x15aafd;
  puStack_3e0 = puVar5;
  cleanup_test_files();
  puStack_ad0 = (uv_fs_t *)0x15ab02;
  uVar3 = uv_default_loop();
  puStack_ad0 = (uv_fs_t *)0x15ab21;
  iVar2 = uv_fs_mkdir(uVar3,auStack_750,"test_dir",0x1ed,0);
  if (iVar2 == 0) {
    puStack_ad0 = (uv_fs_t *)0x15ab2e;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ab53;
    iVar2 = uv_fs_open(uVar3,&uStack_908,"test_dir/file1",0x41,0x180,0);
    puVar4 = puVar5;
    if (iVar2 < 0) goto LAB_0015aef9;
    puVar4 = &uStack_908;
    puStack_ad0 = (uv_fs_t *)0x15ab6b;
    uv_fs_req_cleanup(puVar4);
    puStack_ad0 = (uv_fs_t *)0x15ab70;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ab82;
    iVar2 = uv_fs_close(uVar3,auStack_ac0,(undefined4)uStack_908.result,0);
    if (iVar2 != 0) goto LAB_0015aefe;
    puStack_ad0 = (uv_fs_t *)0x15ab94;
    uv_fs_req_cleanup(auStack_ac0);
    puStack_ad0 = (uv_fs_t *)0x15ab99;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15abbe;
    iVar2 = uv_fs_open(uVar3,&uStack_908,"test_dir/file2",0x41,0x180,0);
    if (iVar2 < 0) goto LAB_0015af03;
    puVar4 = &uStack_908;
    puStack_ad0 = (uv_fs_t *)0x15abd6;
    uv_fs_req_cleanup(puVar4);
    puStack_ad0 = (uv_fs_t *)0x15abdb;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15abed;
    iVar2 = uv_fs_close(uVar3,auStack_ac0,(undefined4)uStack_908.result,0);
    if (iVar2 != 0) goto LAB_0015af08;
    puStack_ad0 = (uv_fs_t *)0x15abff;
    uv_fs_req_cleanup(auStack_ac0);
    puStack_ad0 = (uv_fs_t *)0x15ac04;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ac23;
    iVar2 = uv_fs_mkdir(uVar3,auStack_750,"test_dir/test_subdir",0x1ed,0);
    if (iVar2 != 0) goto LAB_0015af0d;
    puStack_ad0 = (uv_fs_t *)0x15ac38;
    uv_fs_req_cleanup(auStack_750);
    puVar4 = &opendir_req;
    puStack_ad0 = (uv_fs_t *)0x15ac51;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15ac56;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ac6a;
    iVar2 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",0);
    puVar5 = (uv_fs_t *)opendir_req.ptr;
    if (iVar2 != 0) goto LAB_0015af12;
    if (opendir_req.fs_type != UV_FS_OPENDIR) goto LAB_0015af17;
    if (opendir_req.result != 0) goto LAB_0015af1c;
    if (opendir_req.ptr == (void *)0x0) goto LAB_0015af21;
    *(uv_dirent_t **)opendir_req.ptr = dirents;
    *(undefined8 *)((long)puVar5 + 8) = 1;
    puStack_ad0 = (uv_fs_t *)0x15acbb;
    uv_fs_req_cleanup(&opendir_req);
    puStack_ad0 = (uv_fs_t *)0x15acc0;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15acd4;
    iVar2 = uv_fs_readdir(uVar3,&readdir_req,puVar5,0);
    if (iVar2 == 0) {
LAB_0015aeef:
      puStack_ad0 = (uv_fs_t *)0x15aef4;
      run_test_fs_readdir_non_empty_dir_cold_21();
      goto LAB_0015aef4;
    }
    lVar6 = 3;
    do {
      __s1 = dirents[0].name;
      puStack_ad0 = (uv_fs_t *)0x15ad09;
      iVar2 = strcmp(dirents[0].name,"file1");
      if (iVar2 != 0) {
        puStack_ad0 = (uv_fs_t *)0x15ad1c;
        iVar2 = strcmp(__s1,"file2");
        if (iVar2 == 0) goto LAB_0015ad33;
        puStack_ad0 = (uv_fs_t *)0x15ad2b;
        iVar2 = strcmp(__s1,"test_subdir");
        if (iVar2 == 0) goto LAB_0015ad33;
LAB_0015aee5:
        puStack_ad0 = (uv_fs_t *)0x15aeea;
        run_test_fs_readdir_non_empty_dir_cold_10();
LAB_0015aeea:
        puStack_ad0 = (uv_fs_t *)0x15aeef;
        run_test_fs_readdir_non_empty_dir_cold_12();
        goto LAB_0015aeef;
      }
LAB_0015ad33:
      puStack_ad0 = (uv_fs_t *)0x15ad3e;
      iVar2 = strcmp(__s1,"test_subdir");
      if (iVar2 == 0) {
        if (dirents[0].type == UV_DIRENT_DIR) goto LAB_0015ad5b;
        goto LAB_0015aeea;
      }
      if (dirents[0].type != UV_DIRENT_FILE) {
        puStack_ad0 = (uv_fs_t *)0x15aee5;
        run_test_fs_readdir_non_empty_dir_cold_11();
        goto LAB_0015aee5;
      }
LAB_0015ad5b:
      puStack_ad0 = (uv_fs_t *)0x15ad63;
      uv_fs_req_cleanup(&readdir_req);
      puStack_ad0 = (uv_fs_t *)0x15ad68;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ad78;
      iVar2 = uv_fs_readdir(uVar3,&readdir_req,puVar5,0);
      lVar6 = lVar6 + -1;
    } while (iVar2 != 0);
    if (lVar6 != 0) goto LAB_0015aeef;
    puStack_ad0 = (uv_fs_t *)0x15ad98;
    uv_fs_req_cleanup(&readdir_req);
    puStack_ad0 = (uv_fs_t *)0x15adb1;
    memset(&closedir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15adb6;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15adc6;
    uv_fs_closedir(uVar3,&closedir_req,puVar5,0);
    if (closedir_req.result != 0) goto LAB_0015af26;
    puStack_ad0 = (uv_fs_t *)0x15ade0;
    uv_fs_req_cleanup(&closedir_req);
    puVar5 = &opendir_req;
    puStack_ad0 = (uv_fs_t *)0x15adf9;
    memset(&opendir_req,0xdb,0x1b8);
    puStack_ad0 = (uv_fs_t *)0x15adfe;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ae17;
    iVar2 = uv_fs_opendir(uVar3,&opendir_req,"test_dir",non_empty_opendir_cb);
    if (iVar2 != 0) goto LAB_0015af2b;
    if (non_empty_opendir_cb_count != 0) goto LAB_0015af30;
    if (non_empty_closedir_cb_count != 0) goto LAB_0015af35;
    puStack_ad0 = (uv_fs_t *)0x15ae3e;
    uVar3 = uv_default_loop();
    puStack_ad0 = (uv_fs_t *)0x15ae48;
    iVar2 = uv_run(uVar3,0);
    if (iVar2 != 0) goto LAB_0015af3a;
    if (non_empty_opendir_cb_count != 1) goto LAB_0015af3f;
    if (non_empty_closedir_cb_count == 1) {
      puStack_ad0 = (uv_fs_t *)0x15ae6f;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15ae8b;
      uv_fs_rmdir(uVar3,auStack_598,"test_subdir",0);
      puStack_ad0 = (uv_fs_t *)0x15ae93;
      uv_fs_req_cleanup(auStack_598);
      puStack_ad0 = (uv_fs_t *)0x15ae98;
      cleanup_test_files();
      puStack_ad0 = (uv_fs_t *)0x15ae9d;
      puVar5 = (uv_fs_t *)uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15aeb1;
      uv_walk(puVar5,close_walk_cb,0);
      puStack_ad0 = (uv_fs_t *)0x15aebb;
      uv_run(puVar5,0);
      puStack_ad0 = (uv_fs_t *)0x15aec0;
      uVar3 = uv_default_loop();
      puStack_ad0 = (uv_fs_t *)0x15aec8;
      iVar2 = uv_loop_close(uVar3);
      if (iVar2 == 0) {
        return 0;
      }
      goto LAB_0015af49;
    }
  }
  else {
LAB_0015aef4:
    puStack_ad0 = (uv_fs_t *)0x15aef9;
    run_test_fs_readdir_non_empty_dir_cold_1();
    puVar4 = puVar5;
LAB_0015aef9:
    puStack_ad0 = (uv_fs_t *)0x15aefe;
    run_test_fs_readdir_non_empty_dir_cold_2();
LAB_0015aefe:
    puStack_ad0 = (uv_fs_t *)0x15af03;
    run_test_fs_readdir_non_empty_dir_cold_3();
LAB_0015af03:
    puStack_ad0 = (uv_fs_t *)0x15af08;
    run_test_fs_readdir_non_empty_dir_cold_4();
LAB_0015af08:
    puStack_ad0 = (uv_fs_t *)0x15af0d;
    run_test_fs_readdir_non_empty_dir_cold_5();
LAB_0015af0d:
    puStack_ad0 = (uv_fs_t *)0x15af12;
    run_test_fs_readdir_non_empty_dir_cold_6();
LAB_0015af12:
    puStack_ad0 = (uv_fs_t *)0x15af17;
    run_test_fs_readdir_non_empty_dir_cold_7();
LAB_0015af17:
    puStack_ad0 = (uv_fs_t *)0x15af1c;
    run_test_fs_readdir_non_empty_dir_cold_8();
LAB_0015af1c:
    puVar5 = puVar4;
    puStack_ad0 = (uv_fs_t *)0x15af21;
    run_test_fs_readdir_non_empty_dir_cold_9();
LAB_0015af21:
    puStack_ad0 = (uv_fs_t *)0x15af26;
    run_test_fs_readdir_non_empty_dir_cold_22();
LAB_0015af26:
    puStack_ad0 = (uv_fs_t *)0x15af2b;
    run_test_fs_readdir_non_empty_dir_cold_13();
LAB_0015af2b:
    puStack_ad0 = (uv_fs_t *)0x15af30;
    run_test_fs_readdir_non_empty_dir_cold_14();
LAB_0015af30:
    puStack_ad0 = (uv_fs_t *)0x15af35;
    run_test_fs_readdir_non_empty_dir_cold_15();
LAB_0015af35:
    puStack_ad0 = (uv_fs_t *)0x15af3a;
    run_test_fs_readdir_non_empty_dir_cold_16();
LAB_0015af3a:
    puStack_ad0 = (uv_fs_t *)0x15af3f;
    run_test_fs_readdir_non_empty_dir_cold_17();
LAB_0015af3f:
    puStack_ad0 = (uv_fs_t *)0x15af44;
    run_test_fs_readdir_non_empty_dir_cold_18();
  }
  puStack_ad0 = (uv_fs_t *)0x15af49;
  run_test_fs_readdir_non_empty_dir_cold_19();
LAB_0015af49:
  puStack_ad0 = (uv_fs_t *)cleanup_test_files;
  run_test_fs_readdir_non_empty_dir_cold_20();
  puStack_ad0 = puVar5;
  uv_fs_unlink(0,auStack_c88,"test_dir/file1",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_unlink(0,auStack_c88,"test_dir/file2",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_rmdir(0,auStack_c88,"test_dir/test_subdir",0);
  uv_fs_req_cleanup(auStack_c88);
  uv_fs_rmdir(0,auStack_c88,"test_dir",0);
  iVar2 = uv_fs_req_cleanup(auStack_c88);
  return iVar2;
}

Assistant:

TEST_IMPL(fs_readdir_empty_dir) {
  const char* path;
  uv_fs_t mkdir_req;
  uv_fs_t rmdir_req;
  int r;
  int nb_entries_read;
  uv_dir_t* dir;

  path = "./empty_dir/";
  uv_fs_mkdir(uv_default_loop(), &mkdir_req, path, 0777, NULL);
  uv_fs_req_cleanup(&mkdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));

  /* Testing the synchronous flavor. */
  r = uv_fs_opendir(uv_default_loop(),
                    &opendir_req,
                    path,
                    NULL);
  ASSERT(r == 0);
  ASSERT(opendir_req.fs_type == UV_FS_OPENDIR);
  ASSERT(opendir_req.result == 0);
  ASSERT(opendir_req.ptr != NULL);
  dir = opendir_req.ptr;
  uv_fs_req_cleanup(&opendir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  dir->dirents = dirents;
  dir->nentries = ARRAY_SIZE(dirents);
  nb_entries_read = uv_fs_readdir(uv_default_loop(),
                                  &readdir_req,
                                  dir,
                                  NULL);
  ASSERT(nb_entries_read == 0);
  uv_fs_req_cleanup(&readdir_req);

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&closedir_req, 0xdb, sizeof(closedir_req));
  uv_fs_closedir(uv_default_loop(), &closedir_req, dir, NULL);
  ASSERT(closedir_req.result == 0);
  uv_fs_req_cleanup(&closedir_req);

  /* Testing the asynchronous flavor. */

  /* Fill the req to ensure that required fields are cleaned up. */
  memset(&opendir_req, 0xdb, sizeof(opendir_req));
  memset(&readdir_req, 0xdb, sizeof(readdir_req));
  memset(&closedir_req, 0xdb, sizeof(closedir_req));

  r = uv_fs_opendir(uv_default_loop(), &opendir_req, path, empty_opendir_cb);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 0);
  ASSERT(empty_closedir_cb_count == 0);
  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(empty_opendir_cb_count == 1);
  ASSERT(empty_closedir_cb_count == 1);
  uv_fs_rmdir(uv_default_loop(), &rmdir_req, path, NULL);
  uv_fs_req_cleanup(&rmdir_req);
  MAKE_VALGRIND_HAPPY();
  return 0;
}